

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

void nn_sws_mask_payload(uint8_t *payload,size_t payload_len,uint8_t *mask,size_t mask_len,
                        int *mask_start_pos)

{
  uint uVar1;
  uint uVar2;
  
  if (mask_len == 0) {
    for (uVar2 = 0; uVar2 < payload_len; uVar2 = uVar2 + 1) {
      payload[uVar2] = payload[uVar2] ^ mask[uVar2 & 3];
    }
  }
  else {
    uVar2 = 0;
    while( true ) {
      uVar1 = uVar2 + *(int *)mask_len & 3;
      if (payload_len <= uVar2) break;
      payload[uVar2] = payload[uVar2] ^ mask[uVar1];
      uVar2 = uVar2 + 1;
    }
    *(uint *)mask_len = uVar1;
  }
  return;
}

Assistant:

static void nn_sws_mask_payload (uint8_t *payload, size_t payload_len,
    const uint8_t *mask, size_t mask_len, int *mask_start_pos)
{
    unsigned i;

    if (mask_start_pos) {
        for (i = 0; i < payload_len; i++) {
            payload [i] ^= mask [(i + *mask_start_pos) % mask_len];
        }

        *mask_start_pos = (i + *mask_start_pos) % mask_len;

        return;
    }
    else {
        for (i = 0; i < payload_len; i++) {
            payload [i] ^= mask [i % mask_len];
        }
        return;
    }
}